

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O1

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrVisibilityMaskKHR *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  byte bVar1;
  XrStructureType XVar2;
  pointer pcVar3;
  PFN_xrStructureTypeToString p_Var4;
  void *value_00;
  XrStructureType __val;
  uint uVar5;
  bool bVar6;
  char *pcVar7;
  XrInstance pXVar8;
  invalid_argument *this;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  uint __len;
  string type_prefix;
  string indexcapacityinput_prefix;
  string vertices_prefix;
  string next_prefix;
  string indices_prefix;
  string indexcountoutput_prefix;
  string vertexcountoutput_prefix;
  string vertexcapacityinput_prefix;
  ostringstream oss_vertexCapacityInput;
  ostringstream oss_vertexCountOutput;
  ostringstream oss_indices;
  ostringstream oss_indexCountOutput;
  ostringstream oss_indexCapacityInput;
  ostringstream oss_vertices;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a08;
  long *local_9e8;
  long local_9e0;
  long local_9d8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_988;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_968;
  string local_948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_908;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  ios_base local_898 [272];
  undefined1 local_788 [24];
  uint auStack_770 [22];
  ios_base local_718 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610 [3];
  ios_base local_5a0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498 [3];
  ios_base local_428 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320 [3];
  ios_base local_2b0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
  local_788._0_8_ = value;
  std::__cxx11::string::_M_construct((ulong)&local_908,'\x12');
  *local_908._M_dataplus._M_p = '0';
  local_908._M_dataplus._M_p[1] = 'x';
  pcVar7 = local_908._M_dataplus._M_p + (local_908._M_string_length - 1);
  lVar10 = 0;
  do {
    bVar1 = local_788[lVar10];
    *pcVar7 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar1 & 0xf];
    pcVar7[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar1 >> 4];
    lVar10 = lVar10 + 1;
    pcVar7 = pcVar7 + -2;
  } while (lVar10 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&local_908);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908._M_dataplus._M_p != &local_908.field_2) {
    operator_delete(local_908._M_dataplus._M_p,local_908.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  local_a48._M_dataplus._M_p = (pointer)&local_a48.field_2;
  pcVar3 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a48,pcVar3,pcVar3 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_a48);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    XVar2 = value->type;
    __val = -XVar2;
    if (0 < (int)XVar2) {
      __val = XVar2;
    }
    __len = 1;
    if (XR_TYPE_SWAPCHAIN_CREATE_INFO < __val) {
      uVar11 = (ulong)__val;
      uVar5 = 4;
      do {
        __len = uVar5;
        uVar9 = (uint)uVar11;
        if (uVar9 < 100) {
          __len = __len - 2;
          goto LAB_001611ff;
        }
        if (uVar9 < 1000) {
          __len = __len - 1;
          goto LAB_001611ff;
        }
        if (uVar9 < 10000) goto LAB_001611ff;
        uVar11 = uVar11 / 10000;
        uVar5 = __len + 4;
      } while (99999 < uVar9);
      __len = __len + 1;
    }
LAB_001611ff:
    local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_908,(char)__len - (char)((int)XVar2 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_908._M_dataplus._M_p + (XVar2 >> 0x1f),__len,__val);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_a48,&local_908);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_908._M_dataplus._M_p != &local_908.field_2) {
      operator_delete(local_908._M_dataplus._M_p,local_908.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_8d8 = 0;
    uStack_8d0 = 0;
    local_8e8 = 0;
    uStack_8e0 = 0;
    local_908.field_2._M_allocated_capacity = 0;
    local_908.field_2._8_8_ = 0;
    local_908._M_dataplus._M_p = (pointer)0x0;
    local_908._M_string_length = 0;
    p_Var4 = gen_dispatch_table->StructureTypeToString;
    pXVar8 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var4)(pXVar8,value->type,(char *)&local_908);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_a48,(char (*) [64])&local_908);
  }
  pcVar3 = (prefix->_M_dataplus)._M_p;
  local_9e8 = local_9d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_9e8,pcVar3,pcVar3 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_9e8);
  value_00 = value->next;
  local_948._M_dataplus._M_p = (pointer)&local_948.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_948,local_9e8,local_9e0 + (long)local_9e8);
  bVar6 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_948,contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_948._M_dataplus._M_p != &local_948.field_2) {
    operator_delete(local_948._M_dataplus._M_p,local_948.field_2._M_allocated_capacity + 1);
  }
  if (bVar6) {
    pcVar3 = (prefix->_M_dataplus)._M_p;
    local_968._M_dataplus._M_p = (pointer)&local_968.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_968,pcVar3,pcVar3 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_968);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_908);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_908,"0x",2);
    *(uint *)((long)&local_908.field_2 + *(long *)(local_908._M_dataplus._M_p + -0x18) + 8) =
         *(uint *)((long)&local_908.field_2 + *(long *)(local_908._M_dataplus._M_p + -0x18) + 8) &
         0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)&local_908);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&local_968,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_788);
    if ((XrVisibilityMaskKHR *)local_788._0_8_ != (XrVisibilityMaskKHR *)(local_788 + 0x10)) {
      operator_delete((void *)local_788._0_8_,local_788._16_8_ + 1);
    }
    pcVar3 = (prefix->_M_dataplus)._M_p;
    local_988._M_dataplus._M_p = (pointer)&local_988.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_988,pcVar3,pcVar3 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_988);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_788);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_788,"0x",2);
    *(uint *)((long)auStack_770 + (long)*(XrVector2f **)(local_788._0_8_ + -0x18)) =
         *(uint *)((long)auStack_770 + (long)*(XrVector2f **)(local_788._0_8_ + -0x18)) & 0xffffffb5
         | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)local_788);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&local_988,local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    local_a08._M_dataplus._M_p = (pointer)&local_a08.field_2;
    pcVar3 = (prefix->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a08,pcVar3,pcVar3 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_a08);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    *(uint *)((long)&local_1a8[0].field_2 + *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 8) =
         *(uint *)((long)&local_1a8[0].field_2 +
                  *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(local_1a8);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[12],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [12])"XrVector2f*",&local_a08,local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320[0]._M_dataplus._M_p != &local_320[0].field_2) {
      operator_delete(local_320[0]._M_dataplus._M_p,local_320[0].field_2._M_allocated_capacity + 1);
    }
    local_a28._M_dataplus._M_p = (pointer)&local_a28.field_2;
    pcVar3 = (prefix->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a28,pcVar3,pcVar3 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_a28);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"0x",2);
    *(uint *)((long)&local_320[0].field_2 + *(long *)(local_320[0]._M_dataplus._M_p + -0x18) + 8) =
         *(uint *)((long)&local_320[0].field_2 +
                  *(long *)(local_320[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)local_320);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&local_a28,local_498);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498[0]._M_dataplus._M_p != &local_498[0].field_2) {
      operator_delete(local_498[0]._M_dataplus._M_p,local_498[0].field_2._M_allocated_capacity + 1);
    }
    pcVar3 = (prefix->_M_dataplus)._M_p;
    local_9a8._M_dataplus._M_p = (pointer)&local_9a8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_9a8,pcVar3,pcVar3 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_9a8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,"0x",2);
    *(uint *)((long)&local_498[0].field_2 + *(long *)(local_498[0]._M_dataplus._M_p + -0x18) + 8) =
         *(uint *)((long)&local_498[0].field_2 +
                  *(long *)(local_498[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)local_498);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&local_9a8,local_610);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_610[0]._M_dataplus._M_p != &local_610[0].field_2) {
      operator_delete(local_610[0]._M_dataplus._M_p,local_610[0].field_2._M_allocated_capacity + 1);
    }
    pcVar3 = (prefix->_M_dataplus)._M_p;
    local_9c8._M_dataplus._M_p = (pointer)&local_9c8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_9c8,pcVar3,pcVar3 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_9c8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"0x",2);
    *(uint *)((long)&local_610[0].field_2 + *(long *)(local_610[0]._M_dataplus._M_p + -0x18) + 8) =
         *(uint *)((long)&local_610[0].field_2 +
                  *(long *)(local_610[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(local_610);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[10],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [10])0x2a72f0,&local_9c8,&local_928);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_928._M_dataplus._M_p != &local_928.field_2) {
      operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_610);
    std::ios_base::~ios_base(local_5a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9c8._M_dataplus._M_p != &local_9c8.field_2) {
      operator_delete(local_9c8._M_dataplus._M_p,local_9c8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
    std::ios_base::~ios_base(local_428);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9a8._M_dataplus._M_p != &local_9a8.field_2) {
      operator_delete(local_9a8._M_dataplus._M_p,local_9a8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    std::ios_base::~ios_base(local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a28._M_dataplus._M_p != &local_a28.field_2) {
      operator_delete(local_a28._M_dataplus._M_p,local_a28.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a08._M_dataplus._M_p != &local_a08.field_2) {
      operator_delete(local_a08._M_dataplus._M_p,local_a08.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_788);
    std::ios_base::~ios_base(local_718);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_988._M_dataplus._M_p != &local_988.field_2) {
      operator_delete(local_988._M_dataplus._M_p,local_988.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_908);
    std::ios_base::~ios_base(local_898);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_968._M_dataplus._M_p != &local_968.field_2) {
      operator_delete(local_968._M_dataplus._M_p,local_968.field_2._M_allocated_capacity + 1);
    }
    if (local_9e8 != local_9d8) {
      operator_delete(local_9e8,local_9d8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a48._M_dataplus._M_p != &local_a48.field_2) {
      operator_delete(local_a48._M_dataplus._M_p,local_a48.field_2._M_allocated_capacity + 1);
    }
    return true;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Invalid Operation");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrVisibilityMaskKHR* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string vertexcapacityinput_prefix = prefix;
        vertexcapacityinput_prefix += "vertexCapacityInput";
        std::ostringstream oss_vertexCapacityInput;
        oss_vertexCapacityInput << "0x" << std::hex << (value->vertexCapacityInput);
        contents.emplace_back("uint32_t", vertexcapacityinput_prefix, oss_vertexCapacityInput.str());
        std::string vertexcountoutput_prefix = prefix;
        vertexcountoutput_prefix += "vertexCountOutput";
        std::ostringstream oss_vertexCountOutput;
        oss_vertexCountOutput << "0x" << std::hex << (value->vertexCountOutput);
        contents.emplace_back("uint32_t", vertexcountoutput_prefix, oss_vertexCountOutput.str());
        std::string vertices_prefix = prefix;
        vertices_prefix += "vertices";
        std::ostringstream oss_vertices;
        oss_vertices << std::hex << reinterpret_cast<const void*>(value->vertices);
        contents.emplace_back("XrVector2f*", vertices_prefix, oss_vertices.str());
        std::string indexcapacityinput_prefix = prefix;
        indexcapacityinput_prefix += "indexCapacityInput";
        std::ostringstream oss_indexCapacityInput;
        oss_indexCapacityInput << "0x" << std::hex << (value->indexCapacityInput);
        contents.emplace_back("uint32_t", indexcapacityinput_prefix, oss_indexCapacityInput.str());
        std::string indexcountoutput_prefix = prefix;
        indexcountoutput_prefix += "indexCountOutput";
        std::ostringstream oss_indexCountOutput;
        oss_indexCountOutput << "0x" << std::hex << (value->indexCountOutput);
        contents.emplace_back("uint32_t", indexcountoutput_prefix, oss_indexCountOutput.str());
        std::string indices_prefix = prefix;
        indices_prefix += "indices";
        std::ostringstream oss_indices;
        oss_indices << "0x" << std::hex << (value->indices);
        contents.emplace_back("uint32_t*", indices_prefix, oss_indices.str());
        return true;
    } catch(...) {
    }
    return false;
}